

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFboStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_1::AttachmentSizeTextureCase::testDepthAttachment
          (AttachmentSizeTextureCase *this,GLenum internalFormat,GLenum attachment,GLint bitsD,
          GLint bitsS)

{
  CallLogWrapper *this_00;
  int s;
  GLuint textureID;
  
  if (attachment != 0x821a) {
    textureID = 0;
    this_00 = &(this->super_AttachmentSizeCase).super_ApiCase.super_CallLogWrapper;
    glu::CallLogWrapper::glGenTextures(this_00,1,&textureID);
    glu::CallLogWrapper::glBindTexture(this_00,0xde1,textureID);
    glu::CallLogWrapper::glTexStorage2D(this_00,0xde1,1,internalFormat,0x80,0x80);
    ApiCase::expectError((ApiCase *)this,0);
    glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,attachment,0xde1,textureID,0);
    s = 0x125d5a4;
    ApiCase::expectError((ApiCase *)this,0);
    checkAttachmentComponentSizeAtLeast
              ((this->super_AttachmentSizeCase).super_ApiCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,this_00,attachment,0xffffffff,-1,-1,-1,bitsD,bitsS,s);
    checkAttachmentComponentSizeExactly
              ((this->super_AttachmentSizeCase).super_ApiCase.super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,this_00,attachment,0,0,0,0,-1,-1,s);
    glu::CallLogWrapper::glFramebufferTexture2D(this_00,0x8d40,attachment,0xde1,0,0);
    glu::CallLogWrapper::glDeleteTextures(this_00,1,&textureID);
  }
  return;
}

Assistant:

void testDepthAttachment (GLenum internalFormat, GLenum attachment, GLint bitsD, GLint bitsS)
	{
		// don't test stencil formats with textures
		if (attachment == GL_DEPTH_STENCIL_ATTACHMENT)
			return;

		GLuint textureID = 0;
		glGenTextures(1, &textureID);
		glBindTexture(GL_TEXTURE_2D, textureID);
		glTexStorage2D(GL_TEXTURE_2D, 1, internalFormat, 128, 128);
		expectError(GL_NO_ERROR);

		glFramebufferTexture2D(GL_FRAMEBUFFER, attachment, GL_TEXTURE_2D, textureID, 0);
		expectError(GL_NO_ERROR);

		checkAttachmentComponentSizeAtLeast	(m_testCtx, *this, GL_FRAMEBUFFER, attachment, -1, -1, -1, -1, bitsD, bitsS);
		checkAttachmentComponentSizeExactly	(m_testCtx, *this, GL_FRAMEBUFFER, attachment, 0, 0, 0, 0, -1, -1);

		glFramebufferTexture2D(GL_FRAMEBUFFER, attachment, GL_TEXTURE_2D, 0, 0);
		glDeleteTextures(1, &textureID);
	}